

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O1

float FastLog2Slow_C(uint32_t v)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  float fVar4;
  double dVar5;
  
  if (v < 0x10000) {
    uVar1 = 0x1f;
    if (v != 0) {
      for (; v >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar3 = (uVar1 ^ 0xffffffe0) + 0x19;
    bVar2 = (byte)iVar3;
    fVar4 = (float)iVar3 + kLog2Table[v >> (bVar2 & 0x1f)];
    if (0xfff < v) {
      return (float)((~(-1 << (bVar2 & 0x1f)) & v) * 0x17 >> 4) / (float)(int)v + fVar4;
    }
  }
  else {
    dVar5 = log((double)v);
    fVar4 = (float)(dVar5 * 1.4426950408889634);
  }
  return fVar4;
}

Assistant:

static float FastLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const int log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    const uint32_t orig_v = v;
    double log_2;
    v >>= log_cnt;
#else
    int log_cnt = 0;
    uint32_t y = 1;
    const uint32_t orig_v = v;
    double log_2;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    log_2 = kLog2Table[v] + log_cnt;
    if (orig_v >= APPROX_LOG_MAX) {
      // Since the division is still expensive, add this correction factor only
      // for large values of 'v'.
      const int correction = (23 * (orig_v & (y - 1))) >> 4;
      log_2 += (double)correction / orig_v;
    }
    return (float)log_2;
  } else {
    return (float)(LOG_2_RECIPROCAL * log((double)v));
  }
}